

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O0

int uv__dlerror(uv_lib_t *lib)

{
  char *pcVar1;
  char *errmsg;
  uv_lib_t *lib_local;
  
  uv__free(lib->errmsg);
  pcVar1 = (char *)dlerror();
  if (pcVar1 == (char *)0x0) {
    lib->errmsg = (char *)0x0;
    lib_local._4_4_ = 0;
  }
  else {
    pcVar1 = uv__strdup(pcVar1);
    lib->errmsg = pcVar1;
    lib_local._4_4_ = -1;
  }
  return lib_local._4_4_;
}

Assistant:

static int uv__dlerror(uv_lib_t* lib) {
  const char* errmsg;

  uv__free(lib->errmsg);

  errmsg = dlerror();

  if (errmsg) {
    lib->errmsg = uv__strdup(errmsg);
    return -1;
  }
  else {
    lib->errmsg = NULL;
    return 0;
  }
}